

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg * __thiscall
fmt::v7::detail::
specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::get_arg(void *param_1,basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *param_2)

{
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::next_arg_id
            ((basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)param_1);
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            (param_2,(int)((ulong)param_1 >> 0x20));
  return (format_arg *)param_1;
}

Assistant:

FMT_CONSTEXPR format_arg get_arg(auto_id) {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }